

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int PaletteSort(PaletteSorting method,WebPPicture *pic,uint32_t *palette_sorted,uint32_t num_colors,
               uint32_t *palette)

{
  uint in_ECX;
  int *in_RDX;
  uint32_t *in_RSI;
  undefined4 in_EDI;
  void *in_R8;
  uint32_t *in_stack_00000920;
  uint32_t in_stack_0000092c;
  uint32_t *in_stack_00000930;
  WebPPicture *in_stack_00000938;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  switch(in_EDI) {
  case 0:
    if ((*in_RDX == 0) && (0x11 < in_ECX)) {
      memcpy(in_R8,in_RDX + 1,(ulong)(in_ECX - 1) << 2);
      *(undefined4 *)((long)in_R8 + (ulong)(in_ECX - 1) * 4) = 0;
    }
    else {
      memcpy(in_R8,in_RDX,(ulong)in_ECX << 2);
    }
    local_4 = 1;
    break;
  case 1:
    PaletteSortMinimizeDeltas
              (in_RSI,(int)((ulong)in_RDX >> 0x20),
               (uint32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    local_4 = 1;
    break;
  case 2:
    local_4 = PaletteSortModifiedZeng
                        (in_stack_00000938,in_stack_00000930,in_stack_0000092c,in_stack_00000920);
    break;
  case 3:
  case 4:
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int PaletteSort(PaletteSorting method, const struct WebPPicture* const pic,
                const uint32_t* const palette_sorted, uint32_t num_colors,
                uint32_t* const palette) {
  switch (method) {
    case kSortedDefault:
      if (palette_sorted[0] == 0 && num_colors > 17) {
        memcpy(palette, palette_sorted + 1,
               (num_colors - 1) * sizeof(*palette_sorted));
        palette[num_colors - 1] = 0;
      } else {
        memcpy(palette, palette_sorted, num_colors * sizeof(*palette));
      }
      return 1;
    case kMinimizeDelta:
      PaletteSortMinimizeDeltas(palette_sorted, num_colors, palette);
      return 1;
    case kModifiedZeng:
      return PaletteSortModifiedZeng(pic, palette_sorted, num_colors, palette);
    case kUnusedPalette:
    case kPaletteSortingNum:
      break;
  }

  assert(0);
  return 0;
}